

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BoundArgFunction<Catch::ConfigData> * __thiscall
Catch::Clara::Detail::BoundArgFunction<Catch::ConfigData>::operator=
          (BoundArgFunction<Catch::ConfigData> *this,BoundArgFunction<Catch::ConfigData> *other)

{
  int iVar1;
  undefined4 extraout_var;
  IArgFunction<Catch::ConfigData> *pIVar2;
  
  if (other->functionObj == (IArgFunction<Catch::ConfigData> *)0x0) {
    pIVar2 = (IArgFunction<Catch::ConfigData> *)0x0;
  }
  else {
    iVar1 = (*other->functionObj->_vptr_IArgFunction[5])();
    pIVar2 = (IArgFunction<Catch::ConfigData> *)CONCAT44(extraout_var,iVar1);
  }
  if (this->functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*this->functionObj->_vptr_IArgFunction[1])();
  }
  this->functionObj = pIVar2;
  return this;
}

Assistant:

BoundArgFunction& operator = ( BoundArgFunction const& other ) {
                IArgFunction<ConfigT>* newFunctionObj = other.functionObj ? other.functionObj->clone() : CLARA_NULL;
                delete functionObj;
                functionObj = newFunctionObj;
                return *this;
            }